

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpu_dlib.cpp
# Opt level: O0

void dlib::cpu::leaky_relu_gradient(tensor *grad,tensor *dest,tensor *gradient_input,float alpha)

{
  undefined1 auVar1 [16];
  enable_if_t<std::is_convertible<tensor_*,_tensor_*>::value____std::is_convertible<tensor_*,_tensor_*>::value,_bool>
  eVar2;
  int iVar3;
  int iVar4;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  size_t sVar7;
  tensor *in_RDX;
  tensor *in_RSI;
  tensor *in_RDI;
  float in_XMM0_Da;
  size_t i_1;
  size_t i;
  float *out;
  float *in;
  float *gi;
  ulong local_48;
  ulong local_40;
  long lVar5;
  long lVar6;
  
  iVar3 = (*in_RDX->_vptr_tensor[2])();
  lVar5 = CONCAT44(extraout_var,iVar3);
  iVar3 = (*in_RSI->_vptr_tensor[2])();
  iVar4 = (*in_RDI->_vptr_tensor[3])();
  lVar6 = CONCAT44(extraout_var_01,iVar4);
  eVar2 = is_same_object<dlib::tensor,dlib::tensor>(in_RDI,in_RDX);
  if (eVar2) {
    for (local_40 = 0; sVar7 = tensor::size(in_RSI), local_40 < sVar7; local_40 = local_40 + 1) {
      if (*(float *)(CONCAT44(extraout_var_00,iVar3) + local_40 * 4) <= 0.0) {
        *(float *)(lVar6 + local_40 * 4) = in_XMM0_Da * *(float *)(lVar5 + local_40 * 4);
      }
      else {
        *(undefined4 *)(lVar6 + local_40 * 4) = *(undefined4 *)(lVar5 + local_40 * 4);
      }
    }
  }
  else {
    for (local_48 = 0; sVar7 = tensor::size(in_RSI), local_48 < sVar7; local_48 = local_48 + 1) {
      if (*(float *)(CONCAT44(extraout_var_00,iVar3) + local_48 * 4) <= 0.0) {
        auVar1 = vfmadd213ss_fma(ZEXT416(*(uint *)(lVar5 + local_48 * 4)),ZEXT416((uint)in_XMM0_Da),
                                 ZEXT416(*(uint *)(lVar6 + local_48 * 4)));
        *(int *)(lVar6 + local_48 * 4) = auVar1._0_4_;
      }
      else {
        *(float *)(lVar6 + local_48 * 4) =
             *(float *)(lVar5 + local_48 * 4) + *(float *)(lVar6 + local_48 * 4);
      }
    }
  }
  return;
}

Assistant:

void leaky_relu_gradient (
            tensor& grad,
            const tensor& dest,
            const tensor& gradient_input,
            const float alpha
        )
        {
            const float* gi = gradient_input.host();
            const float* in = dest.host();
            float* out = grad.host();
            if (is_same_object(grad, gradient_input))
            {
                for (size_t i = 0; i < dest.size(); ++i)
                {
                    if (in[i] > 0)
                        out[i] = gi[i];
                    else
                        out[i] = alpha * gi[i];
                }
            }
            else
            {
                for (size_t i = 0; i < dest.size(); ++i)
                {
                    if (in[i] > 0)
                        out[i] += gi[i];
                    else
                        out[i] += alpha * gi[i];
                }
            }
        }